

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

bool __thiscall duckdb::DBConfig::CanAccessFile(DBConfig *this,string *input_path,FileType type)

{
  ulong uVar1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *pcVar2;
  bool bVar3;
  size_type sVar4;
  iterator iVar5;
  iterator iVar6;
  long lVar7;
  size_type sVar8;
  ulong uVar9;
  long lVar10;
  allocator local_b1;
  string path;
  string prefix;
  string local_70;
  string local_50;
  
  bVar3 = true;
  if ((this->options).enable_external_access == false) {
    SanitizeAllowedPath(&path,this,input_path);
    sVar4 = ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::count(&(this->options).allowed_paths._M_h,&path);
    bVar3 = true;
    if (sVar4 == 0) {
      if ((this->options).allowed_directories._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)
      {
        bVar3 = false;
      }
      else {
        if (type == FILE_TYPE_DIR) {
          ::std::__cxx11::string::string((string *)&prefix,"/",&local_b1);
          bVar3 = StringUtil::EndsWith(&path,&prefix);
          ::std::__cxx11::string::~string((string *)&prefix);
          if (!bVar3) {
            ::std::__cxx11::string::append((char *)&path);
          }
        }
        this_00 = &(this->options).allowed_directories;
        iVar5 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::lower_bound(&this_00->_M_t,&path);
        if (iVar5._M_node !=
            (this->options).allowed_directories._M_t._M_impl.super__Rb_tree_header._M_header._M_left
           ) {
          iVar5._M_node = (_Base_ptr)::std::_Rb_tree_decrement(iVar5._M_node);
        }
        iVar6 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::upper_bound(&this_00->_M_t,&path);
        prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
        prefix._M_string_length = 0;
        prefix.field_2._M_local_buf[0] = '\0';
        for (; iVar5._M_node != iVar6._M_node;
            iVar5._M_node = (_Base_ptr)::std::_Rb_tree_increment(iVar5._M_node)) {
          ::std::__cxx11::string::string((string *)&local_50,(string *)&path);
          ::std::__cxx11::string::string((string *)&local_70,(string *)(iVar5._M_node + 1));
          bVar3 = StringUtil::StartsWith(&local_50,&local_70);
          ::std::__cxx11::string::~string((string *)&local_70);
          ::std::__cxx11::string::~string((string *)&local_50);
          if (bVar3) {
            ::std::__cxx11::string::_M_assign((string *)&prefix);
            break;
          }
        }
        if (prefix._M_string_length == 0) {
          bVar3 = false;
        }
        else {
          lVar7 = 0;
          sVar8 = prefix._M_string_length;
          while (bVar3 = path._M_string_length <= sVar8, lVar10 = 3, uVar9 = sVar8, !bVar3) {
            do {
              uVar1 = uVar9 + 1;
              lVar10 = lVar10 + -1;
              if (path._M_string_length <= uVar9) break;
              pcVar2 = path._M_dataplus._M_p + uVar9;
              uVar9 = uVar1;
            } while (*pcVar2 != '/');
            if (((lVar10 == 0) && (path._M_dataplus._M_p[sVar8] == '.')) &&
               (path._M_dataplus._M_p[sVar8 + 1] == '.')) {
              uVar9 = 0xffffffffffffffff;
              if (lVar7 == 0) goto LAB_01468c40;
            }
            else {
              uVar9 = (ulong)(lVar10 != 2);
            }
            lVar7 = lVar7 + uVar9;
            sVar8 = uVar1;
          }
          bVar3 = true;
        }
LAB_01468c40:
        ::std::__cxx11::string::~string((string *)&prefix);
      }
    }
    ::std::__cxx11::string::~string((string *)&path);
  }
  return bVar3;
}

Assistant:

bool DBConfig::CanAccessFile(const string &input_path, FileType type) {
	if (options.enable_external_access) {
		// all external access is allowed
		return true;
	}
	string path = SanitizeAllowedPath(input_path);
	if (options.allowed_paths.count(path) > 0) {
		// path is explicitly allowed
		return true;
	}
	if (options.allowed_directories.empty()) {
		// no prefix directories specified
		return false;
	}
	if (type == FileType::FILE_TYPE_DIR) {
		// make sure directories end with a /
		if (!StringUtil::EndsWith(path, "/")) {
			path += "/";
		}
	}
	auto start_bound = options.allowed_directories.lower_bound(path);
	if (start_bound != options.allowed_directories.begin()) {
		--start_bound;
	}
	auto end_bound = options.allowed_directories.upper_bound(path);

	string prefix;
	for (auto it = start_bound; it != end_bound; ++it) {
		if (StringUtil::StartsWith(path, *it)) {
			prefix = *it;
			break;
		}
	}
	if (prefix.empty()) {
		// no common prefix found - path is not inside an allowed directory
		return false;
	}
	D_ASSERT(StringUtil::EndsWith(prefix, "/"));
	// path is inside an allowed directory - HOWEVER, we could still exit the allowed directory using ".."
	// we check if we ever exit the allowed directory using ".." by looking at the path fragments
	idx_t directory_level = 0;
	idx_t current_pos = prefix.size();
	for (; current_pos < path.size(); current_pos++) {
		idx_t dir_begin = current_pos;
		// find either the end of the path or the directory separator
		for (; path[current_pos] != '/' && current_pos < path.size(); current_pos++) {
		}
		idx_t path_length = current_pos - dir_begin;
		if (path_length == 2 && path[dir_begin] == '.' && path[dir_begin + 1] == '.') {
			// go up a directory
			if (directory_level == 0) {
				// we cannot go up past the prefix
				return false;
			}
			--directory_level;
		} else if (path_length > 0) {
			directory_level++;
		}
	}
	return true;
}